

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

t_int * vsnapshot_tilde_perform(t_int *w)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  lVar2 = w[2];
  iVar1 = *(int *)(lVar2 + 0x30);
  if (0 < (long)iVar1) {
    lVar3 = w[1];
    lVar4 = *(long *)(lVar2 + 0x38);
    lVar5 = 0;
    do {
      *(undefined4 *)(lVar4 + lVar5 * 4) = *(undefined4 *)(lVar3 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  dVar6 = clock_getlogicaltime();
  *(double *)(lVar2 + 0x48) = dVar6;
  *(undefined4 *)(lVar2 + 0x34) = 1;
  return w + 3;
}

Assistant:

static t_int *vsnapshot_tilde_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_vsnapshot *x = (t_vsnapshot *)(w[2]);
    t_sample *out = x->x_vec;
    int n = x->x_n, i;
    for (i = 0; i < n; i++)
        out[i] = in[i];
    x->x_time = clock_getlogicaltime();
    x->x_gotone = 1;
    return (w+3);
}